

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::Move(GeneralizedSuffixTree *this,uint string,uint pos)

{
  uint uVar1;
  pointer pbVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  
  uVar4 = (ulong)string;
  pbVar2 = (this->strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar4 < (ulong)((long)(this->strings).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
     ((ulong)pos <= pbVar2[uVar4]._M_string_length)) {
    while( true ) {
      if (this->active_length == 0) {
        return;
      }
      this->active_edge =
           (int)(this->strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p[pos];
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->active_node->edges,&this->active_edge);
      uVar1 = pmVar3->length;
      if (this->active_length <= uVar1 - 1) break;
      pos = pos + uVar1;
      this->active_node = (Node *)pmVar3->field_0;
      this->active_length = this->active_length - uVar1;
    }
    return;
  }
  __assert_fail("string < strings.size() && pos <= strings[string].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0x105,"void SuffixTree::GeneralizedSuffixTree::Move(uint, uint)");
}

Assistant:

void GeneralizedSuffixTree::Move (uint string, uint pos)
{
    assert (string < strings.size() && pos <= strings[string].size());
	for (;;)
    {
        if (!active_length)
            break;
        active_edge = static_cast<uint> (strings[string][pos]);
        Edge &edge = active_node->edges[active_edge];
        if (!edge.length)
            break;
        if (active_length < edge.length)
            break;
        pos += edge.length;
        active_node = edge.node;
        active_length -= edge.length;
    }
}